

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Safaia.h
# Opt level: O0

void __thiscall Safaia::Server::loop(Server *this)

{
  int local_70;
  int i_1;
  reference_wrapper<Safaia::Resp> local_60;
  reference_wrapper<std::vector<Safaia::Route,_std::allocator<Safaia::Route>_>_> local_58;
  reference_wrapper<bool> local_50;
  reference_wrapper<Safaia::Log> local_48;
  reference_wrapper<int> local_40;
  thread local_38;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Server *this_local;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  for (local_2c = 0; local_2c < this->thread; local_2c = local_2c + 1) {
    local_40 = std::ref<int>(&this->sockfd);
    local_48 = std::ref<Safaia::Log>((Log *)logger);
    local_50 = std::ref<bool>(&this->soft_stop);
    local_58 = std::ref<std::vector<Safaia::Route,std::allocator<Safaia::Route>>>(&this->vec_routes)
    ;
    local_60 = std::ref<Safaia::Resp>(&this->not_found);
    std::thread::
    thread<void(&)(int,Safaia::Log&,bool&,std::vector<Safaia::Route,std::allocator<Safaia::Route>>&,Safaia::Resp&),std::reference_wrapper<int>,std::reference_wrapper<Safaia::Log>,std::reference_wrapper<bool>,std::reference_wrapper<std::vector<Safaia::Route,std::allocator<Safaia::Route>>>,std::reference_wrapper<Safaia::Resp>,void>
              (&local_38,serve,&local_40,&local_48,&local_50,&local_58,&local_60);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_28,&local_38);
    std::thread::~thread(&local_38);
  }
  for (local_70 = 0; local_70 < this->thread; local_70 = local_70 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_28,(long)local_70);
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  return;
}

Assistant:

void loop(){
            std::vector<std::thread> threads;
            for (int i = 0; i < thread; i++){
                threads.push_back(std::thread(serve, std::ref(sockfd), std::ref(logger), std::ref(soft_stop), std::ref(vec_routes), std::ref(not_found)));
            }
            for (int i = 0; i < thread; i++){
                threads[i].join();
            }

        }